

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O2

lyd_node * lyd_new(lyd_node *parent,lys_module *module,char *name)

{
  int iVar1;
  lys_node *siblings;
  size_t sVar2;
  lyd_node *plVar3;
  LY_ERR *pLVar4;
  lys_node *local_38;
  lys_node *snode;
  
  local_38 = (lys_node *)0x0;
  if (((parent != (lyd_node *)0x0 || module != (lys_module *)0x0) && name != (char *)0x0) &&
     (siblings = lyd_new_find_schema(parent,module,0), siblings != (lys_node *)0x0)) {
    sVar2 = strlen(name);
    iVar1 = lys_get_data_sibling
                      (module,siblings,name,(int)sVar2,
                       LYS_ACTION|LYS_RPC|LYS_NOTIF|LYS_LIST|LYS_CONTAINER,&local_38);
    if (iVar1 == 0 && local_38 != (lys_node *)0x0) {
      plVar3 = _lyd_new(parent,local_38,0);
      return plVar3;
    }
  }
  pLVar4 = ly_errno_location();
  *pLVar4 = LY_EINVAL;
  return (lyd_node *)0x0;
}

Assistant:

struct lyd_node *
_lyd_new(struct lyd_node *parent, const struct lys_node *schema, int dflt)
{
    struct lyd_node *ret;

    ret = calloc(1, sizeof *ret);
    if (!ret) {
        LOGMEM;
        return NULL;
    }
    ret->schema = (struct lys_node *)schema;
    ret->validity = ly_new_node_validity(schema);
    if (resolve_applies_when(schema, 0, NULL)) {
        ret->when_status = LYD_WHEN;
    }
    ret->prev = ret;
    ret->dflt = dflt;
    if (parent) {
        if (lyd_insert(parent, ret)) {
            lyd_free(ret);
            return NULL;
        }
    }
    return ret;
}